

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void sha256_write_byte_block(sha256_t *p)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint32_t uVar26;
  uint uVar27;
  uint32_t uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint32_t data32 [16];
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_10c;
  uint local_108;
  uint local_78 [18];
  
  for (lVar10 = 10; lVar10 != 0x1a; lVar10 = lVar10 + 1) {
    uVar1 = p->state[lVar10];
    local_78[lVar10 + -10] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  uVar1 = p->state[1];
  uVar2 = p->state[2];
  uVar3 = p->state[3];
  uVar4 = p->state[4];
  uVar5 = p->state[5];
  uVar6 = p->state[6];
  uVar7 = p->state[7];
  uVar29 = 0;
  uVar8 = 0;
  uVar22 = 0;
  uVar24 = 0;
  uVar16 = 0;
  local_13c = 0;
  local_154 = 0;
  local_150 = 0;
  local_138 = 0;
  local_158 = 0;
  local_14c = 0;
  local_148 = 0;
  local_144 = 0;
  local_140 = 0;
  local_15c = 0;
  local_160 = 0;
  uVar11 = p->state[0];
  uVar12 = uVar1;
  uVar15 = uVar2;
  uVar26 = uVar3;
  uVar28 = uVar4;
  uVar21 = uVar7;
  local_10c = uVar5;
  local_108 = uVar6;
  for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 0x10) {
    uVar20 = local_78[8];
    uVar31 = local_78[7];
    uVar19 = local_78[6];
    uVar18 = local_78[5];
    uVar25 = local_78[3];
    uVar9 = local_78[1];
    uVar30 = local_78[0];
    uVar23 = local_78[2];
    uVar17 = local_78[4];
    if (uVar14 != 0) {
      uVar30 = uVar29 + local_158 +
               (uVar8 >> 3 ^ (uVar8 << 0xe | uVar8 >> 0x12) ^ (uVar8 << 0x19 | uVar8 >> 7)) +
               (local_15c >> 10 ^
               (local_15c << 0xd | local_15c >> 0x13) ^ (local_15c << 0xf | local_15c >> 0x11));
      uVar9 = uVar8 + local_14c +
              (uVar22 >> 3 ^ (uVar22 << 0xe | uVar22 >> 0x12) ^ (uVar22 << 0x19 | uVar22 >> 7)) +
              (local_160 >> 10 ^
              (local_160 << 0xd | local_160 >> 0x13) ^ (local_160 << 0xf | local_160 >> 0x11));
      uVar23 = uVar22 + local_148 +
               (uVar24 >> 3 ^ (uVar24 << 0xe | uVar24 >> 0x12) ^ (uVar24 << 0x19 | uVar24 >> 7)) +
               (uVar30 >> 10 ^
               (uVar30 * 0x2000 | uVar30 >> 0x13) ^ (uVar30 * 0x8000 | uVar30 >> 0x11));
      uVar25 = uVar24 + local_144 +
               (uVar16 >> 3 ^ (uVar16 << 0xe | uVar16 >> 0x12) ^ (uVar16 << 0x19 | uVar16 >> 7)) +
               (uVar9 >> 10 ^ (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
      uVar17 = uVar16 + local_140 +
               (local_13c >> 3 ^
               (local_13c << 0xe | local_13c >> 0x12) ^ (local_13c << 0x19 | local_13c >> 7)) +
               (uVar23 >> 10 ^
               (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11));
      uVar18 = local_13c + local_15c +
               (local_154 >> 3 ^
               (local_154 << 0xe | local_154 >> 0x12) ^ (local_154 << 0x19 | local_154 >> 7)) +
               (uVar25 >> 10 ^
               (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
      uVar19 = local_154 + local_160 +
               (local_150 >> 3 ^
               (local_150 << 0xe | local_150 >> 0x12) ^ (local_150 << 0x19 | local_150 >> 7)) +
               (uVar17 >> 10 ^
               (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11));
      uVar20 = local_138 + uVar9 +
               (local_158 >> 3 ^
               (local_158 << 0xe | local_158 >> 0x12) ^ (local_158 << 0x19 | local_158 >> 7)) +
               (uVar19 >> 10 ^
               (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11));
      uVar31 = local_150 + uVar30 +
               (local_138 >> 3 ^
               (local_138 << 0xe | local_138 >> 0x12) ^ (local_138 << 0x19 | local_138 >> 7)) +
               (uVar18 >> 10 ^
               (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11));
    }
    uVar16 = uVar17;
    uVar22 = uVar23;
    uVar29 = uVar30;
    uVar8 = uVar9;
    uVar24 = uVar25;
    local_13c = uVar18;
    local_154 = uVar19;
    local_150 = uVar31;
    local_114 = local_78[9];
    if (uVar14 != 0) {
      local_114 = local_158 + uVar22 +
                  (local_14c >> 3 ^
                  (local_14c << 0xe | local_14c >> 0x12) ^ (local_14c << 0x19 | local_14c >> 7)) +
                  (local_150 >> 10 ^
                  (local_150 << 0xd | local_150 >> 0x13) ^ (local_150 << 0xf | local_150 >> 0x11));
    }
    uVar31 = local_78[10];
    if (uVar14 != 0) {
      uVar31 = local_14c + uVar24 +
               (local_148 >> 3 ^
               (local_148 << 0xe | local_148 >> 0x12) ^ (local_148 << 0x19 | local_148 >> 7)) +
               (uVar20 >> 10 ^ (uVar20 << 0xd | uVar20 >> 0x13) ^ (uVar20 << 0xf | uVar20 >> 0x11));
    }
    local_118 = local_78[0xb];
    if (uVar14 != 0) {
      local_118 = local_148 + uVar16 +
                  (local_144 >> 3 ^
                  (local_144 << 0xe | local_144 >> 0x12) ^ (local_144 << 0x19 | local_144 >> 7)) +
                  (local_114 >> 10 ^
                  (local_114 << 0xd | local_114 >> 0x13) ^ (local_114 << 0xf | local_114 >> 0x11));
    }
    local_11c = local_78[0xc];
    if (uVar14 != 0) {
      local_11c = local_144 + local_13c +
                  (local_140 >> 3 ^
                  (local_140 << 0xe | local_140 >> 0x12) ^ (local_140 << 0x19 | local_140 >> 7)) +
                  (uVar31 >> 10 ^
                  (uVar31 << 0xd | uVar31 >> 0x13) ^ (uVar31 << 0xf | uVar31 >> 0x11));
    }
    uVar19 = local_78[0xd];
    if (uVar14 != 0) {
      uVar19 = local_140 + local_154 +
               (local_15c >> 3 ^
               (local_15c << 0xe | local_15c >> 0x12) ^ (local_15c << 0x19 | local_15c >> 7)) +
               (local_118 >> 10 ^
               (local_118 << 0xd | local_118 >> 0x13) ^ (local_118 << 0xf | local_118 >> 0x11));
    }
    uVar18 = local_78[0xe];
    if (uVar14 != 0) {
      uVar18 = local_15c + local_150 +
               (local_160 >> 3 ^
               (local_160 << 0xe | local_160 >> 0x12) ^ (local_160 << 0x19 | local_160 >> 7)) +
               (local_11c >> 10 ^
               (local_11c << 0xd | local_11c >> 0x13) ^ (local_11c << 0xf | local_11c >> 0x11));
    }
    uVar25 = local_78[0xf];
    if (uVar14 != 0) {
      uVar25 = local_160 + uVar20 +
               (uVar29 >> 3 ^ (uVar29 << 0xe | uVar29 >> 0x12) ^ (uVar29 << 0x19 | uVar29 >> 7)) +
               (uVar19 >> 10 ^ (uVar19 << 0xd | uVar19 >> 0x13) ^ (uVar19 << 0xf | uVar19 >> 0x11));
    }
    iVar13 = uVar21 + ((uVar28 << 7 | uVar28 >> 0x19) ^
                      (uVar28 << 0x15 | uVar28 >> 0xb) ^ (uVar28 << 0x1a | uVar28 >> 6)) +
             ((local_108 ^ local_10c) & uVar28 ^ local_108) + K[uVar14] + uVar29;
    uVar30 = uVar26 + iVar13;
    uVar21 = ((uVar12 | uVar11) & uVar15 | uVar12 & uVar11) +
             ((uVar11 << 10 | uVar11 >> 0x16) ^
             (uVar11 << 0x13 | uVar11 >> 0xd) ^ (uVar11 << 0x1e | uVar11 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 1] + local_108 + ((local_10c ^ uVar28) & uVar30 ^ local_10c) + uVar8 +
             ((uVar30 * 0x80 | uVar30 >> 0x19) ^
             (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6));
    uVar15 = uVar15 + iVar13;
    uVar9 = ((uVar21 | uVar11) & uVar12 | uVar21 & uVar11) +
            ((uVar21 * 0x400 | uVar21 >> 0x16) ^
            (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 2] + local_10c + ((uVar30 ^ uVar28) & uVar15 ^ uVar28) + uVar22 +
             ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6));
    uVar12 = uVar12 + iVar13;
    uVar17 = ((uVar9 | uVar21) & uVar11 | uVar9 & uVar21) +
             ((uVar9 * 0x400 | uVar9 >> 0x16) ^
             (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 3] + uVar28 + ((uVar15 ^ uVar30) & uVar12 ^ uVar30) + uVar24 +
             ((uVar12 * 0x80 | uVar12 >> 0x19) ^
             (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6));
    uVar11 = uVar11 + iVar13;
    uVar27 = ((uVar17 | uVar9) & uVar21 | uVar17 & uVar9) +
             ((uVar17 * 0x400 | uVar17 >> 0x16) ^
             (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 4] + uVar30 + ((uVar12 ^ uVar15) & uVar11 ^ uVar15) + uVar16 +
             ((uVar11 * 0x80 | uVar11 >> 0x19) ^
             (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6));
    uVar21 = uVar21 + iVar13;
    uVar23 = ((uVar27 | uVar17) & uVar9 | uVar27 & uVar17) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 5] + uVar15 + ((uVar11 ^ uVar12) & uVar21 ^ uVar12) + local_13c +
             ((uVar21 * 0x80 | uVar21 >> 0x19) ^
             (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6));
    uVar9 = uVar9 + iVar13;
    uVar30 = ((uVar23 | uVar27) & uVar17 | uVar23 & uVar27) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 6] + uVar12 + ((uVar21 ^ uVar11) & uVar9 ^ uVar11) + local_154 +
             ((uVar9 * 0x80 | uVar9 >> 0x19) ^
             (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6));
    uVar17 = uVar17 + iVar13;
    uVar12 = ((uVar30 | uVar23) & uVar27 | uVar30 & uVar23) +
             ((uVar30 * 0x400 | uVar30 >> 0x16) ^
             (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 7] + uVar11 + ((uVar9 ^ uVar21) & uVar17 ^ uVar21) + local_150 +
             ((uVar17 * 0x80 | uVar17 >> 0x19) ^
             (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6));
    uVar27 = uVar27 + iVar13;
    uVar11 = ((uVar12 | uVar30) & uVar23 | uVar12 & uVar30) +
             ((uVar12 * 0x400 | uVar12 >> 0x16) ^
             (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 8] + uVar21 + ((uVar17 ^ uVar9) & uVar27 ^ uVar9) + uVar20 +
             ((uVar27 * 0x80 | uVar27 >> 0x19) ^
             (uVar27 * 0x200000 | uVar27 >> 0xb) ^ (uVar27 * 0x4000000 | uVar27 >> 6));
    uVar23 = uVar23 + iVar13;
    uVar21 = ((uVar11 | uVar12) & uVar30 | uVar11 & uVar12) +
             ((uVar11 * 0x400 | uVar11 >> 0x16) ^
             (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 9] + uVar9 + ((uVar27 ^ uVar17) & uVar23 ^ uVar17) + local_114 +
             ((uVar23 * 0x80 | uVar23 >> 0x19) ^
             (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
    uVar30 = uVar30 + iVar13;
    uVar15 = ((uVar21 | uVar11) & uVar12 | uVar21 & uVar11) +
             ((uVar21 * 0x400 | uVar21 >> 0x16) ^
             (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 10] + uVar17 + ((uVar23 ^ uVar27) & uVar30 ^ uVar27) + uVar31 +
             ((uVar30 * 0x80 | uVar30 >> 0x19) ^
             (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6));
    uVar12 = uVar12 + iVar13;
    uVar17 = ((uVar15 | uVar21) & uVar11 | uVar15 & uVar21) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 0xb] + uVar27 + ((uVar30 ^ uVar23) & uVar12 ^ uVar23) + local_118 +
             ((uVar12 * 0x80 | uVar12 >> 0x19) ^
             (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6));
    uVar11 = uVar11 + iVar13;
    uVar9 = ((uVar17 | uVar15) & uVar21 | uVar17 & uVar15) +
            ((uVar17 * 0x400 | uVar17 >> 0x16) ^
            (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 0xc] + uVar23 + ((uVar12 ^ uVar30) & uVar11 ^ uVar30) + local_11c +
             ((uVar11 * 0x80 | uVar11 >> 0x19) ^
             (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6));
    uVar21 = uVar21 + iVar13;
    uVar26 = ((uVar9 | uVar17) & uVar15 | uVar9 & uVar17) +
             ((uVar9 * 0x400 | uVar9 >> 0x16) ^
             (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 0xd] + uVar30 + ((uVar11 ^ uVar12) & uVar21 ^ uVar12) + uVar19 +
             ((uVar21 * 0x80 | uVar21 >> 0x19) ^
             (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6));
    local_108 = uVar15 + iVar13;
    uVar15 = ((uVar26 | uVar9) & uVar17 | uVar26 & uVar9) +
             ((uVar26 * 0x400 | uVar26 >> 0x16) ^
             (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 0xe] + uVar12 + ((uVar21 ^ uVar11) & local_108 ^ uVar11) + uVar18 +
             ((local_108 * 0x80 | local_108 >> 0x19) ^
             (local_108 * 0x200000 | local_108 >> 0xb) ^ (local_108 * 0x4000000 | local_108 >> 6));
    local_10c = uVar17 + iVar13;
    uVar12 = ((uVar15 | uVar26) & uVar9 | uVar15 & uVar26) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar13;
    iVar13 = K[uVar14 + 0xf] + uVar11 + ((local_108 ^ uVar21) & local_10c ^ uVar21) + uVar25 +
             ((local_10c * 0x80 | local_10c >> 0x19) ^
             (local_10c * 0x200000 | local_10c >> 0xb) ^ (local_10c * 0x4000000 | local_10c >> 6));
    uVar28 = uVar9 + iVar13;
    uVar11 = ((uVar12 | uVar15) & uVar26 | uVar12 & uVar15) +
             ((uVar12 * 0x400 | uVar12 >> 0x16) ^
             (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar13;
    local_158 = local_114;
    local_148 = local_118;
    local_144 = local_11c;
    local_160 = uVar25;
    local_15c = uVar18;
    local_14c = uVar31;
    local_140 = uVar19;
    local_138 = uVar20;
  }
  p->state[0] = uVar11 + p->state[0];
  p->state[1] = uVar12 + uVar1;
  p->state[2] = uVar15 + uVar2;
  p->state[3] = uVar26 + uVar3;
  p->state[4] = uVar28 + uVar4;
  p->state[5] = local_10c + uVar5;
  p->state[6] = local_108 + uVar6;
  p->state[7] = uVar21 + uVar7;
  return;
}

Assistant:

static void
sha256_write_byte_block(sha256_t *p)
{
  uint32_t data32[16];
  unsigned i;
  for (i = 0; i < 16; i++)
    data32[i] =
      ((uint32_t)(p->buffer[i * 4    ]) << 24) +
      ((uint32_t)(p->buffer[i * 4 + 1]) << 16) +
      ((uint32_t)(p->buffer[i * 4 + 2]) <<  8) +
      ((uint32_t)(p->buffer[i * 4 + 3]));
  sha256_transform(p->state, data32);
}